

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Jsrt.cpp
# Opt level: O0

JsErrorCode JsGetProperty(JsValueRef object,JsPropertyIdRef propertyId,JsValueRef *value)

{
  anon_class_24_3_c03980c9 fn;
  JsErrorCode JVar1;
  JsValueRef **in_stack_ffffffffffffffc0;
  JsValueRef *local_20;
  JsValueRef *value_local;
  JsPropertyIdRef propertyId_local;
  JsValueRef object_local;
  
  fn.object = &local_20;
  fn.propertyId = &propertyId_local;
  fn.value = in_stack_ffffffffffffffc0;
  local_20 = value;
  value_local = (JsValueRef *)propertyId;
  propertyId_local = object;
  JVar1 = ContextAPIWrapper<false,JsGetProperty::__0>(fn);
  return JVar1;
}

Assistant:

CHAKRA_API JsGetProperty(_In_ JsValueRef object, _In_ JsPropertyIdRef propertyId, _Out_ JsValueRef *value)
{
    return ContextAPIWrapper<JSRT_MAYBE_TRUE>([&] (Js::ScriptContext *scriptContext,
        TTDRecorder& _actionEntryPopper) -> JsErrorCode {
        PERFORM_JSRT_TTD_RECORD_ACTION(scriptContext, RecordJsRTGetProperty, (const Js::PropertyRecord *)propertyId, object);

        VALIDATE_INCOMING_OBJECT(object, scriptContext);
        VALIDATE_INCOMING_PROPERTYID(propertyId);
        PARAM_NOT_NULL(value);
        *value = nullptr;

        Js::RecyclableObject * instance = Js::VarTo<Js::RecyclableObject>(object);
        JsErrorCode err = JsGetPropertyCommon(scriptContext, instance, (const Js::PropertyRecord *)propertyId,
             value);

        PERFORM_JSRT_TTD_RECORD_ACTION_RESULT(scriptContext, value);

        return err;
    });
}